

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# literal.cpp
# Opt level: O0

Literal * __thiscall wasm::Literal::externalize(Literal *__return_storage_ptr__,Literal *this)

{
  initializer_list<wasm::Literal> init;
  bool bVar1;
  bool bVar2;
  BasicHeapType BVar3;
  Literal *local_148;
  HeapType local_118;
  shared_ptr<wasm::GCData> local_110;
  HeapType local_100;
  shared_ptr<wasm::GCData> local_f8;
  HeapType local_e8;
  Literal *local_e0;
  Literal local_d8;
  iterator local_c0;
  undefined8 local_b8;
  undefined1 local_b0 [56];
  shared_ptr<wasm::GCData> local_78;
  BasicHeapType local_64;
  undefined1 auStack_60 [4];
  BasicHeapType extType;
  HeapType heapType;
  HeapType local_48;
  shared_ptr<wasm::GCData> local_40;
  HeapType local_30;
  Shareability local_24;
  HeapType HStack_20;
  Shareability share;
  Literal *local_18;
  Literal *this_local;
  
  local_18 = this;
  this_local = __return_storage_ptr__;
  bVar1 = wasm::Type::isRef(&this->type);
  bVar2 = false;
  if (bVar1) {
    HStack_20 = wasm::Type::getHeapType(&this->type);
    BVar3 = HeapType::getUnsharedTop(&stack0xffffffffffffffe0);
    bVar2 = false;
    if (BVar3 == any) {
      bVar2 = true;
    }
  }
  if (bVar2) {
    local_30 = wasm::Type::getHeapType(&this->type);
    local_24 = HeapType::getShared(&local_30);
    bVar2 = isNull(this);
    if (bVar2) {
      std::shared_ptr<wasm::GCData>::shared_ptr(&local_40);
      BVar3 = HeapType::getBasic((HeapType *)&HeapTypes::noext,local_24);
      HeapType::HeapType(&local_48,BVar3);
      Literal(__return_storage_ptr__,&local_40,local_48);
      std::shared_ptr<wasm::GCData>::~shared_ptr(&local_40);
    }
    else {
      _auStack_60 = wasm::Type::getHeapType(&this->type);
      local_64 = HeapType::getBasic((HeapType *)&HeapTypes::ext,local_24);
      bVar2 = HeapType::isMaybeShared((HeapType *)auStack_60,i31);
      if (bVar2) {
        local_e0 = &local_d8;
        Literal(local_e0,this);
        local_c0 = &local_d8;
        local_b8 = 1;
        init._M_len = 1;
        init._M_array = local_c0;
        Literals::Literals((Literals *)local_b0,init);
        std::make_shared<wasm::GCData,wasm::HeapType&,wasm::Literals>
                  ((HeapType *)&local_78,(Literals *)auStack_60);
        HeapType::HeapType(&local_e8,local_64);
        Literal(__return_storage_ptr__,&local_78,local_e8);
        std::shared_ptr<wasm::GCData>::~shared_ptr(&local_78);
        Literals::~Literals((Literals *)local_b0);
        local_148 = (Literal *)&local_c0;
        do {
          local_148 = local_148 + 0xffffffffffffffff;
          ~Literal(local_148);
        } while (local_148 != &local_d8);
      }
      else {
        bVar2 = HeapType::isMaybeShared((HeapType *)auStack_60,any);
        if (bVar2) {
          std::shared_ptr<wasm::GCData>::shared_ptr(&local_f8,(shared_ptr<wasm::GCData> *)this);
          BVar3 = HeapType::getBasic((HeapType *)&HeapTypes::string,local_24);
          HeapType::HeapType(&local_100,BVar3);
          Literal(__return_storage_ptr__,&local_f8,local_100);
          std::shared_ptr<wasm::GCData>::~shared_ptr(&local_f8);
        }
        else {
          std::shared_ptr<wasm::GCData>::shared_ptr(&local_110,(shared_ptr<wasm::GCData> *)this);
          HeapType::HeapType(&local_118,local_64);
          Literal(__return_storage_ptr__,&local_110,local_118);
          std::shared_ptr<wasm::GCData>::~shared_ptr(&local_110);
        }
      }
    }
    return __return_storage_ptr__;
  }
  __assert_fail("type.isRef() && type.getHeapType().getUnsharedTop() == HeapType::any && \"can only externalize internal references\""
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/literal.cpp"
                ,0xb44,"Literal wasm::Literal::externalize() const");
}

Assistant:

Literal Literal::externalize() const {
  assert(type.isRef() && type.getHeapType().getUnsharedTop() == HeapType::any &&
         "can only externalize internal references");
  auto share = type.getHeapType().getShared();
  if (isNull()) {
    return Literal(std::shared_ptr<GCData>{}, HeapTypes::noext.getBasic(share));
  }
  auto heapType = type.getHeapType();
  auto extType = HeapTypes::ext.getBasic(share);
  if (heapType.isMaybeShared(HeapType::i31)) {
    return Literal(std::make_shared<GCData>(heapType, Literals{*this}),
                   extType);
  }
  if (heapType.isMaybeShared(HeapType::any)) {
    // Anyref literals turn into strings (if we add any other anyref literals,
    // we will need to be more careful here).
    return Literal(gcData, HeapTypes::string.getBasic(share));
  }
  return Literal(gcData, extType);
}